

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int * Cba_ObjAttrArray(Cba_Ntk_t *p,int i)

{
  int iVar1;
  int *local_20;
  int i_local;
  Cba_Ntk_t *p_local;
  
  if (-1 < i) {
    iVar1 = Cba_ObjAttr(p,i);
    if (iVar1 == 0) {
      local_20 = (int *)0x0;
    }
    else {
      iVar1 = Cba_ObjAttr(p,i);
      local_20 = Vec_IntEntryP(&p->vAttrSto,iVar1 + 1);
    }
    return local_20;
  }
  __assert_fail("i>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                ,0xf4,"int *Cba_ObjAttrArray(Cba_Ntk_t *, int)");
}

Assistant:

static inline int *          Cba_ObjAttrArray( Cba_Ntk_t * p, int i )        { assert(i>=0); return Cba_ObjAttr(p, i) ? Vec_IntEntryP(&p->vAttrSto, Cba_ObjAttr(p, i)+1) : NULL; }